

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

void free_code(code_pointer cp)

{
  void *pvVar1;
  ulong local_28;
  uint64 i;
  void *arg;
  vec *ex;
  code_pointer cp_local;
  
  for (local_28 = 0; local_28 < (cp->inst).size; local_28 = local_28 + 1) {
    pvVar1 = (*(cp->inst).get_ele)(&cp->inst,local_28);
    if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 8));
    }
  }
  free((cp->inst).start);
  return;
}

Assistant:

void free_code(code_pointer cp) {
    struct vec *ex = &cp->inst;
    void *arg;
    for (uint64 i = 0; i < ex->size; i++) {
        arg = ((instruction *) ex->get_ele(ex, i))->arg;
        if (arg != NULL)
            free(arg);
    }
    free(ex->start);
}